

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper_regs.h
# Opt level: O3

void hreg_swap_gpr_tgpr(CPUPPCState_conflict2 *env)

{
  target_ulong tVar1;
  target_ulong tVar2;
  target_ulong tVar3;
  target_ulong tVar4;
  target_ulong tVar5;
  
  tVar1 = env->tgpr[1];
  tVar2 = env->gpr[0];
  tVar3 = env->gpr[1];
  tVar4 = env->gpr[2];
  tVar5 = env->gpr[3];
  env->gpr[0] = env->tgpr[0];
  env->gpr[1] = tVar1;
  env->tgpr[0] = tVar2;
  env->tgpr[1] = tVar3;
  tVar1 = env->tgpr[3];
  env->gpr[2] = env->tgpr[2];
  env->gpr[3] = tVar1;
  env->tgpr[2] = tVar4;
  env->tgpr[3] = tVar5;
  return;
}

Assistant:

static inline void hreg_swap_gpr_tgpr(CPUPPCState *env)
{
    target_ulong tmp;

    tmp = env->gpr[0];
    env->gpr[0] = env->tgpr[0];
    env->tgpr[0] = tmp;
    tmp = env->gpr[1];
    env->gpr[1] = env->tgpr[1];
    env->tgpr[1] = tmp;
    tmp = env->gpr[2];
    env->gpr[2] = env->tgpr[2];
    env->tgpr[2] = tmp;
    tmp = env->gpr[3];
    env->gpr[3] = env->tgpr[3];
    env->tgpr[3] = tmp;
}